

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_mem_pool.cpp
# Opt level: O0

MppMemPoolImpl * __thiscall
MppMemPoolService::get_pool(MppMemPoolService *this,char *caller,size_t size)

{
  Mutex *mutex;
  undefined1 local_48 [8];
  AutoMutex auto_lock;
  pthread_mutexattr_t attr;
  MppMemPoolImpl *pool;
  size_t size_local;
  char *caller_local;
  MppMemPoolService *this_local;
  
  this_local = (MppMemPoolService *)mpp_osal_malloc("get_pool",0x80);
  if (this_local == (MppMemPoolService *)0x0) {
    this_local = (MppMemPoolService *)0x0;
  }
  else {
    pthread_mutexattr_init((pthread_mutexattr_t *)((long)&auto_lock.mLock + 4));
    pthread_mutexattr_settype((pthread_mutexattr_t *)((long)&auto_lock.mLock + 4),1);
    pthread_mutex_init((pthread_mutex_t *)
                       &(((MppMemPoolService *)((list_head *)this_local + 1))->mLink).prev,
                       (pthread_mutexattr_t *)((long)&auto_lock.mLock + 4));
    pthread_mutexattr_destroy((pthread_mutexattr_t *)((long)&auto_lock.mLock + 4));
    ((list_head *)&((list_head *)this_local)->next)->next = (list_head *)this_local;
    ((list_head *)this_local)->prev = (list_head *)caller;
    ((list_head *)this_local)[1].next = (list_head *)size;
    *(undefined4 *)&((list_head *)this_local)[7].next = 0;
    *(undefined4 *)((long)&((list_head *)this_local)[7].next + 4) = 0;
    *(undefined4 *)&((list_head *)this_local)[7].prev = 0;
    ((list_head *)this_local)[5].next = (list_head *)this_local + 5;
    ((list_head *)this_local)[5].prev = (list_head *)this_local + 5;
    ((list_head *)this_local)[6].next = (list_head *)this_local + 6;
    ((list_head *)this_local)[6].prev = (list_head *)this_local + 6;
    ((list_head *)this_local)[4].next = (list_head *)this_local + 4;
    ((list_head *)this_local)[4].prev = (list_head *)this_local + 4;
    mutex = get_lock();
    Mutex::Autolock::Autolock((Autolock *)local_48,mutex,1);
    list_add_tail((list_head *)this_local + 4,&this->mLink);
    Mutex::Autolock::~Autolock((Autolock *)local_48);
  }
  return (MppMemPoolImpl *)this_local;
}

Assistant:

MppMemPoolImpl *MppMemPoolService::get_pool(const char *caller, size_t size)
{
    MppMemPoolImpl *pool = mpp_malloc(MppMemPoolImpl, 1);
    if (NULL == pool)
        return NULL;

    pthread_mutexattr_t attr;
    pthread_mutexattr_init(&attr);
    pthread_mutexattr_settype(&attr, PTHREAD_MUTEX_RECURSIVE);
    pthread_mutex_init(&pool->lock, &attr);
    pthread_mutexattr_destroy(&attr);

    pool->check = pool;
    pool->caller = caller;
    pool->size = size;
    pool->used_count = 0;
    pool->unused_count = 0;
    pool->finalized = 0;

    INIT_LIST_HEAD(&pool->used);
    INIT_LIST_HEAD(&pool->unused);
    INIT_LIST_HEAD(&pool->service_link);
    AutoMutex auto_lock(get_lock());
    list_add_tail(&pool->service_link, &mLink);

    return pool;
}